

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

ExtensionSet * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetExtensionSet
          (GeneratedMessageReflection *this,Message *message)

{
  LogMessage *other;
  void *ptr;
  byte local_51;
  LogMessage local_50;
  Message *local_18;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_51 = 0;
  local_18 = message;
  message_local = (Message *)this;
  if (this->extensions_offset_ == -1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x4ae);
    local_51 = 1;
    other = LogMessage::operator<<(&local_50,"CHECK failed: (extensions_offset_) != (-1): ");
    LogFinisher::operator=((LogFinisher *)((long)&ptr + 3),other);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  return (ExtensionSet *)
         ((long)&(local_18->super_MessageLite)._vptr_MessageLite + (long)this->extensions_offset_);
}

Assistant:

inline const ExtensionSet& GeneratedMessageReflection::GetExtensionSet(
    const Message& message) const {
  GOOGLE_DCHECK_NE(extensions_offset_, -1);
  const void* ptr = reinterpret_cast<const uint8*>(&message) +
                    extensions_offset_;
  return *reinterpret_cast<const ExtensionSet*>(ptr);
}